

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectActiveSubroutineUniformName
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **uniform_names)

{
  code *pcVar1;
  char *__s1;
  GLint GVar2;
  undefined1 uVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  size_type sVar8;
  reference pvVar9;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar10;
  reference local_1e8;
  MessageBuilder local_1e0;
  int local_60;
  byte local_59;
  GLint name;
  bool is_name_ok;
  GLint uniform;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> active_uniform_name;
  GLint n_active_subroutine_uniforms;
  bool result;
  Functions *gl;
  GLchar **uniform_names_local;
  GLuint program_id_local;
  FunctionalTest3_4 *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  active_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
  active_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_48);
  (**(code **)(lVar7 + 0x9d0))
            (program_id,0x8b31,0x8de6,
             &active_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
            );
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xdc5);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_48,
             (long)(this->m_n_active_subroutine_uniform_name_length + 1));
  name = 0;
  do {
    GVar2 = name;
    if ((int)active_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ <=
        name) {
LAB_01019731:
      uVar3 = active_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_48);
      return (bool)(uVar3 & 1);
    }
    local_59 = 0;
    pcVar1 = *(code **)(lVar7 + 0x740);
    sVar8 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_48);
    pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)local_48,0);
    (*pcVar1)(program_id,0x8b31,GVar2,sVar8 & 0xffffffff,0,pvVar9);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"GetActiveSubroutineUniformName",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xdcf);
    for (local_60 = 0;
        local_60 <
        (int)active_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
        local_60 = local_60 + 1) {
      __s1 = uniform_names[local_60];
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)local_48,0);
      iVar4 = strcmp(__s1,pvVar9);
      if (iVar4 == 0) {
        local_59 = 1;
        break;
      }
    }
    if ((local_59 & 1) == 0) {
      this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      this_01 = tcu::TestContext::getLog(this_00);
      tcu::TestLog::operator<<(&local_1e0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (&local_1e0,
                           (char (*) [73])
                           "Error. Invalid result. Function: getActiveSubroutineUniformName. idnex: "
                          );
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&name);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [11])0x2a1a404);
      local_1e8 = std::vector<char,_std::allocator<char>_>::operator[]
                            ((vector<char,_std::allocator<char>_> *)local_48,0);
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_1e8);
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1e0);
      active_uniform_name.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
      goto LAB_01019731;
    }
    name = name + 1;
  } while( true );
}

Assistant:

bool FunctionalTest3_4::inspectActiveSubroutineUniformName(GLuint program_id, const GLchar** uniform_names) const
{
	const glw::Functions& gl						   = m_context.getRenderContext().getFunctions();
	bool				  result					   = true;
	GLint				  n_active_subroutine_uniforms = 0;
	std::vector<GLchar>   active_uniform_name;

	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	active_uniform_name.resize(m_n_active_subroutine_uniform_name_length + 1);

	for (GLint uniform = 0; uniform < n_active_subroutine_uniforms; ++uniform)
	{
		bool is_name_ok = false;

		gl.getActiveSubroutineUniformName(program_id, GL_VERTEX_SHADER, uniform, (GLsizei)active_uniform_name.size(),
										  0 /* length */, &active_uniform_name[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveSubroutineUniformName");

		for (GLint name = 0; name < n_active_subroutine_uniforms; ++name)
		{
			if (0 == strcmp(uniform_names[name], &active_uniform_name[0]))
			{
				is_name_ok = true;
				break;
			}
		}

		if (false == is_name_ok)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Error. Invalid result. Function: getActiveSubroutineUniformName. idnex: " << uniform
				<< ". Result: " << &active_uniform_name[0] << tcu::TestLog::EndMessage;

			result = false;
			break;
		}
	}

	return result;
}